

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleCompactMap(SingleDocParser *this,EventHandler *eventHandler)

{
  undefined4 uVar1;
  Scanner *this_00;
  bool bVar2;
  Token *pTVar3;
  long *in_RSI;
  undefined8 in_RDI;
  Mark mark;
  EventHandler *in_stack_000001c8;
  SingleDocParser *in_stack_000001d0;
  value type;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  type = (value)((ulong)in_RDI >> 0x20);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf26e00);
  CollectionStack::PushCollectionType
            ((CollectionStack *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),type);
  pTVar3 = Scanner::peek((Scanner *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar1 = (pTVar3->mark).pos;
  this_00 = (Scanner *)CONCAT44(uVar1,in_stack_ffffffffffffffe0);
  Scanner::pop(this_00);
  HandleNode(in_stack_000001d0,in_stack_000001c8);
  bVar2 = Scanner::empty((Scanner *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  if (!bVar2) {
    pTVar3 = Scanner::peek((Scanner *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
    if (pTVar3->type == VALUE) {
      Scanner::pop((Scanner *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
      HandleNode(in_stack_000001d0,in_stack_000001c8);
      goto LAB_00f26e9d;
    }
  }
  (**(code **)(*in_RSI + 0x20))(in_RSI,&stack0xffffffffffffffe4,0);
LAB_00f26e9d:
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf26eaa);
  CollectionStack::PopCollectionType
            ((CollectionStack *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),type);
  return;
}

Assistant:

void SingleDocParser::HandleCompactMap(EventHandler& eventHandler) {
  m_pCollectionStack->PushCollectionType(CollectionType::CompactMap);

  // grab key
  Mark mark = m_scanner.peek().mark;
  m_scanner.pop();
  HandleNode(eventHandler);

  // now grab value (optional)
  if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
    m_scanner.pop();
    HandleNode(eventHandler);
  } else {
    eventHandler.OnNull(mark, NullAnchor);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::CompactMap);
}